

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void Test_Template_TemplateRootDirectory::Run(void)

{
  byte bVar1;
  bool bVar2;
  undefined8 uVar3;
  char *pcVar4;
  allocator local_1f1;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [32];
  string local_1a8 [32];
  TemplateString local_188;
  undefined8 local_168;
  Template *tpl;
  long local_140;
  size_type sep_pos;
  char *path_sep;
  char *kPathSeps;
  long local_108;
  Template *tpl3;
  string local_f8 [32];
  TemplateString local_d8;
  long local_b8;
  Template *tpl2;
  string local_a8 [32];
  TemplateString local_88;
  long local_68;
  Template *tpl1;
  allocator local_49;
  string local_48 [32];
  ctemplate local_28 [8];
  string filename;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Test template",&local_49);
  ctemplate::StringToTemplateFile(local_28,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  bVar1 = ctemplate::IsAbspath((string *)local_28);
  if ((bVar1 & 1) == 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x54a,"IsAbspath(filename)");
    bVar1 = ctemplate::IsAbspath((string *)local_28);
    if ((bVar1 & 1) == 0) {
      __assert_fail("IsAbspath(filename)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x54a,"static void Test_Template_TemplateRootDirectory::Run()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_88,(string *)local_28);
  local_68 = ctemplate::Template::GetTemplate(&local_88,DO_NOT_STRIP);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,(char *)&ctemplate::kRootdir,(allocator *)((long)&tpl2 + 7))
  ;
  ctemplate::Template::SetTemplateRootDirectory((string *)local_a8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl2 + 7));
  ctemplate::TemplateString::TemplateString(&local_d8,(string *)local_28);
  local_b8 = ctemplate::Template::GetTemplate(&local_d8,DO_NOT_STRIP);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"/sadfadsf/waerfsa/safdg",(allocator *)((long)&tpl3 + 7));
  ctemplate::Template::SetTemplateRootDirectory((string *)local_f8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl3 + 7));
  ctemplate::TemplateString::TemplateString((TemplateString *)&kPathSeps,(string *)local_28);
  local_108 = ctemplate::Template::GetTemplate((TemplateString *)&kPathSeps,DO_NOT_STRIP);
  if (local_68 == 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x551,"tpl1 != NULL");
    if (local_68 != 0) {
      exit(1);
    }
    __assert_fail("tpl1 != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x551,"static void Test_Template_TemplateRootDirectory::Run()");
  }
  if (local_68 != local_b8) {
    printf("ASSERT FAILED, line %d: %s\n",0x552,"tpl1 == tpl2");
    if (local_68 == local_b8) {
      exit(1);
    }
    __assert_fail("tpl1 == tpl2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x552,"static void Test_Template_TemplateRootDirectory::Run()");
  }
  if (local_68 == local_108) {
    path_sep = "/\\";
    sep_pos = (size_type)anon_var_dwarf_7f93;
    do {
      if (*(char *)sep_pos == '\0') {
        std::__cxx11::string::~string((string *)local_28);
        return;
      }
      local_140 = std::__cxx11::string::find((char)local_28,(ulong)(uint)(int)*(char *)sep_pos);
      while (local_140 != -1) {
        std::__cxx11::string::substr((ulong)&tpl,(ulong)local_28);
        ctemplate::Template::SetTemplateRootDirectory((string *)&tpl);
        std::__cxx11::string::~string((string *)&tpl);
        std::__cxx11::string::substr((ulong)local_1a8,(ulong)local_28);
        ctemplate::TemplateString::TemplateString(&local_188,local_1a8);
        uVar3 = ctemplate::Template::GetTemplate(&local_188,DO_NOT_STRIP);
        std::__cxx11::string::~string((string *)local_1a8);
        local_168 = uVar3;
        pcVar4 = (char *)ctemplate::Template::template_file();
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c8,pcVar4,&local_1c9);
        pcVar4 = (char *)ctemplate::Template::template_file();
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1c8,pcVar4);
        std::__cxx11::string::~string(local_1c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          printf("ASSERT FAILED, line %d: %s\n",0x561,
                 "string(tpl->template_file()) == tpl1->template_file()");
          pcVar4 = (char *)ctemplate::Template::template_file();
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1f0,pcVar4,&local_1f1);
          pcVar4 = (char *)ctemplate::Template::template_file();
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1f0,pcVar4);
          if (!bVar2) {
            __assert_fail("string(tpl->template_file()) == tpl1->template_file()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                          ,0x561,"static void Test_Template_TemplateRootDirectory::Run()");
          }
          std::__cxx11::string::~string(local_1f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
          exit(1);
        }
        local_140 = std::__cxx11::string::find((char)local_28,(ulong)(uint)(int)*(char *)sep_pos);
      }
      sep_pos = sep_pos + 1;
    } while( true );
  }
  printf("ASSERT FAILED, line %d: %s\n",0x553,"tpl1 == tpl3");
  if (local_68 == local_108) {
    exit(1);
  }
  __assert_fail("tpl1 == tpl3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                ,0x553,"static void Test_Template_TemplateRootDirectory::Run()");
}

Assistant:

TEST(Template, TemplateRootDirectory) {
  string filename = StringToTemplateFile("Test template");
  ASSERT(IsAbspath(filename));
  Template* tpl1 = Template::GetTemplate(filename, DO_NOT_STRIP);
  Template::SetTemplateRootDirectory(kRootdir);  // "/"
  // template-root shouldn't matter for absolute directories
  Template* tpl2 = Template::GetTemplate(filename, DO_NOT_STRIP);
  Template::SetTemplateRootDirectory("/sadfadsf/waerfsa/safdg");
  Template* tpl3 = Template::GetTemplate(filename, DO_NOT_STRIP);
  ASSERT(tpl1 != NULL);
  ASSERT(tpl1 == tpl2);
  ASSERT(tpl1 == tpl3);

  // Now test it actually works by breaking the abspath in various places.
  // We do it twice, since we don't know if the path-sep is "/" or "\".
  // NOTE: this depends on filename not using "/" or "\" except as a
  //       directory separator (so nothing like "/var/tmp/foo\a/weirdfile").
  const char* const kPathSeps = "/\\";
  for (const char* path_sep = kPathSeps; *path_sep; path_sep++) {
    for (string::size_type sep_pos = filename.find(*path_sep, 0);
         sep_pos != string::npos;
         sep_pos = filename.find(*path_sep, sep_pos + 1)) {
      Template::SetTemplateRootDirectory(filename.substr(0, sep_pos + 1));
      Template* tpl = Template::GetTemplate(filename.substr(sep_pos + 1),
                                            DO_NOT_STRIP);
      ASSERT(string(tpl->template_file()) == tpl1->template_file());
    }
  }
}